

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2cell_id.cc
# Opt level: O0

void InitLookupCell(int level,int i,int j,int orig_orientation,int pos,int orientation)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int pos_00;
  long lVar4;
  int *r;
  int ij;
  int orientation_local;
  int pos_local;
  int orig_orientation_local;
  int j_local;
  int i_local;
  int level_local;
  
  if (level == 4) {
    iVar1 = i * 0x10 + j;
    lookup_pos[iVar1 * 4 + orig_orientation] = (short)(pos << 2) + (short)orientation;
    lookup_ij[pos * 4 + orig_orientation] = (short)iVar1 * 4 + (short)orientation;
  }
  else {
    iVar1 = level + 1;
    iVar2 = i * 2;
    iVar3 = j * 2;
    pos_00 = pos * 4;
    lVar4 = (long)orientation * 0x10;
    InitLookupCell(iVar1,iVar2 + ((int)*(uint *)(S2::internal::kPosToIJ + lVar4) >> 1),
                   iVar3 + (*(uint *)(S2::internal::kPosToIJ + lVar4) & 1),orig_orientation,pos_00,
                   orientation ^ 1);
    InitLookupCell(iVar1,iVar2 + (*(int *)(S2::internal::kPosToIJ + lVar4 + 4) >> 1),
                   iVar3 + (*(uint *)(S2::internal::kPosToIJ + lVar4 + 4) & 1),orig_orientation,
                   pos_00 + 1,orientation);
    InitLookupCell(iVar1,iVar2 + (*(int *)(S2::internal::kPosToIJ + lVar4 + 8) >> 1),
                   iVar3 + (*(uint *)(S2::internal::kPosToIJ + lVar4 + 8) & 1),orig_orientation,
                   pos_00 + 2,orientation);
    InitLookupCell(iVar1,iVar2 + (*(int *)(S2::internal::kPosToIJ + lVar4 + 0xc) >> 1),
                   iVar3 + (*(uint *)(S2::internal::kPosToIJ + lVar4 + 0xc) & 1),orig_orientation,
                   pos_00 + 3,orientation ^ 3);
  }
  return;
}

Assistant:

static void InitLookupCell(int level, int i, int j, int orig_orientation,
                           int pos, int orientation) {
  if (level == kLookupBits) {
    int ij = (i << kLookupBits) + j;
    lookup_pos[(ij << 2) + orig_orientation] = (pos << 2) + orientation;
    lookup_ij[(pos << 2) + orig_orientation] = (ij << 2) + orientation;
  } else {
    level++;
    i <<= 1;
    j <<= 1;
    pos <<= 2;
    const int* r = kPosToIJ[orientation];
    InitLookupCell(level, i + (r[0] >> 1), j + (r[0] & 1), orig_orientation,
                   pos, orientation ^ kPosToOrientation[0]);
    InitLookupCell(level, i + (r[1] >> 1), j + (r[1] & 1), orig_orientation,
                   pos + 1, orientation ^ kPosToOrientation[1]);
    InitLookupCell(level, i + (r[2] >> 1), j + (r[2] & 1), orig_orientation,
                   pos + 2, orientation ^ kPosToOrientation[2]);
    InitLookupCell(level, i + (r[3] >> 1), j + (r[3] & 1), orig_orientation,
                   pos + 3, orientation ^ kPosToOrientation[3]);
  }
}